

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void __thiscall clip_ctx::clip_ctx(clip_ctx *this,clip_context_params *ctx_params)

{
  ggml_backend_t *__args;
  pointer *pppgVar1;
  iterator iVar2;
  pointer ppgVar3;
  ggml_backend_buffer_type *in_RAX;
  ggml_backend_t pgVar4;
  undefined8 uVar5;
  pointer __p;
  ggml_backend *pgVar6;
  ggml_backend_buffer_type *local_38;
  
  this->has_glm_projector = false;
  this->has_qwen2vl_merger = false;
  this->has_text_encoder = false;
  this->has_vision_encoder = false;
  this->has_llava_projector = false;
  this->has_minicpmv_projector = false;
  this->minicpmv_version = 2;
  (this->vision_model).hparams.proj_scale_factor = 0;
  (this->vision_model).hparams.mm_patch_merge_type = PATCH_MERGE_FLAT;
  (this->vision_model).hparams.eps = 1e-06;
  (this->vision_model).hparams.rope_theta = 0.0;
  (this->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vision_model).hparams.vision_feature_layer._M_h._M_buckets =
       &(this->vision_model).hparams.vision_feature_layer._M_h._M_single_bucket;
  (this->vision_model).hparams.vision_feature_layer._M_h._M_bucket_count = 1;
  (this->vision_model).hparams.vision_feature_layer._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->vision_model).hparams.vision_feature_layer._M_h._M_element_count = 0;
  (this->vision_model).hparams.vision_feature_layer._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vision_model).hparams.vision_feature_layer._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vision_model).hparams.vision_feature_layer._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->vision_model).class_embedding = (ggml_tensor *)0x0;
  (this->vision_model).patch_embeddings_0 = (ggml_tensor *)0x0;
  (this->vision_model).patch_embeddings_1 = (ggml_tensor *)0x0;
  (this->vision_model).patch_bias = (ggml_tensor *)0x0;
  (this->vision_model).position_embeddings = (ggml_tensor *)0x0;
  (this->vision_model).pre_ln_w = (ggml_tensor *)0x0;
  (this->vision_model).pre_ln_b = (ggml_tensor *)0x0;
  (this->vision_model).layers.super__Vector_base<clip_layer,_std::allocator<clip_layer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vision_model).layers.super__Vector_base<clip_layer,_std::allocator<clip_layer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vision_model).layers.super__Vector_base<clip_layer,_std::allocator<clip_layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->use_gelu = false;
  this->use_silu = false;
  (this->buf)._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
  super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl = (ggml_backend_buffer *)0x0;
  local_38 = in_RAX;
  memset(&(this->vision_model).mm_0_w,0,0x204);
  (this->ctx_gguf)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
  super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
  super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl = (gguf_context *)0x0;
  (this->ctx_data)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl = (ggml_context *)0x0;
  (this->buf_compute_meta).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buf_compute_meta).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buf_compute_meta).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->backend_buft).
  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->backend_buft).
  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->backend_buft).
  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_nodes = 0x2000;
  (this->sched)._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
  super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl = (ggml_backend_sched *)0x0;
  pgVar4 = (ggml_backend_t)ggml_backend_init_by_type(0,0);
  __args = &this->backend_cpu;
  this->backend_cpu = pgVar4;
  if (ctx_params->use_gpu == false) {
    this->backend = (ggml_backend_t)0x0;
  }
  else {
    pgVar4 = (ggml_backend_t)ggml_backend_init_by_type(1,0);
    this->backend = pgVar4;
    if (pgVar4 != (ggml_backend_t)0x0) {
      if ((int)g_logger_state.verbosity_thold < 3) {
        uVar5 = ggml_backend_name(pgVar4);
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: CLIP using %s backend\n","clip_ctx",uVar5);
      }
      iVar2._M_current =
           (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ggml_backend*,std::allocator<ggml_backend*>>::
        _M_realloc_insert<ggml_backend*const&>
                  ((vector<ggml_backend*,std::allocator<ggml_backend*>> *)&this->backend_ptrs,iVar2,
                   &this->backend);
        pgVar6 = this->backend;
      }
      else {
        pgVar6 = this->backend;
        *iVar2._M_current = pgVar6;
        pppgVar1 = &(this->backend_ptrs).
                    super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppgVar1 = *pppgVar1 + 1;
      }
      local_38 = (ggml_backend_buffer_type *)ggml_backend_get_default_buffer_type(pgVar6);
      std::vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>>::
      emplace_back<ggml_backend_buffer_type*>
                ((vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>> *)
                 &this->backend_buft,&local_38);
      goto LAB_0014967e;
    }
    pgVar4 = *__args;
  }
  this->backend = pgVar4;
  if ((int)g_logger_state.verbosity_thold < 3) {
    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: CLIP using CPU backend\n","clip_ctx");
  }
LAB_0014967e:
  iVar2._M_current =
       (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ggml_backend*,std::allocator<ggml_backend*>>::_M_realloc_insert<ggml_backend*const&>
              ((vector<ggml_backend*,std::allocator<ggml_backend*>> *)&this->backend_ptrs,iVar2,
               __args);
    pgVar6 = *__args;
  }
  else {
    pgVar6 = this->backend_cpu;
    *iVar2._M_current = pgVar6;
    pppgVar1 = &(this->backend_ptrs).
                super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppgVar1 = *pppgVar1 + 1;
  }
  local_38 = (ggml_backend_buffer_type *)ggml_backend_get_default_buffer_type(pgVar6);
  std::vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>>::
  emplace_back<ggml_backend_buffer_type*>
            ((vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>> *)
             &this->backend_buft,&local_38);
  ppgVar3 = (this->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __p = (pointer)ggml_backend_sched_new
                           (ppgVar3,(this->backend_buft).
                                    super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)(this->backend_ptrs).
                                          super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppgVar3
                                   ) >> 3,0x2000,0);
  std::__uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>::reset
            ((__uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter> *)&this->sched,__p);
  return;
}

Assistant:

clip_ctx(clip_context_params & ctx_params) {
        backend_cpu = ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_CPU, nullptr);
        backend     = ctx_params.use_gpu
                        ? ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_GPU, nullptr)
                        : nullptr;

        if (backend) {
            LOG_INF("%s: CLIP using %s backend\n", __func__, ggml_backend_name(backend));
            backend_ptrs.push_back(backend);
            backend_buft.push_back(ggml_backend_get_default_buffer_type(backend));
        } else {
            backend = backend_cpu;
            LOG_INF("%s: CLIP using CPU backend\n", __func__);
        }

        backend_ptrs.push_back(backend_cpu);
        backend_buft.push_back(ggml_backend_get_default_buffer_type(backend_cpu));

        sched.reset(
            ggml_backend_sched_new(backend_ptrs.data(), backend_buft.data(), backend_ptrs.size(), 8192, false)
        );
    }